

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)18>_> * __thiscall
vkt::tessellation::GraphicsPipelineBuilder::build
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,
          GraphicsPipelineBuilder *this,DeviceInterface *vk,VkDevice device,
          VkPipelineLayout pipelineLayout,VkRenderPass renderPass)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  VkVertexInputAttributeDescription *pVVar4;
  VkPipelineDepthStencilStateCreateInfo *pVVar5;
  VkPrimitiveTopology VVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> dynamicStates;
  VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkRect2D scissor;
  VkViewport viewport;
  VkGraphicsPipelineCreateInfo graphicsPipelineInfo;
  VkPipelineDynamicStateCreateInfo pipelineDynamicStateInfo;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> local_2f8;
  VkDevice local_2d8;
  undefined1 local_2d0 [32];
  undefined8 local_2b0;
  VkStencilOp local_2a8;
  VkStencilOp local_2a4;
  VkVertexInputAttributeDescription *local_2a0;
  deUint32 local_298;
  VkVertexInputAttributeDescription *local_290;
  VkPipelineInputAssemblyStateCreateInfo local_288;
  undefined1 local_268 [32];
  VkBool32 local_248;
  VkVertexInputAttributeDescription *local_240;
  VkPipelineRasterizationStateCreateInfo local_238;
  undefined1 local_1f8 [56];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  uint *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  VkPipelineDepthStencilStateCreateInfo local_190;
  VkVertexInputAttributeDescription local_128;
  VkVertexInputAttributeDescription local_118;
  undefined8 local_108;
  VkGraphicsPipelineCreateInfo local_100;
  VkStructureType local_70;
  void *local_68;
  VkPipelineDepthStencilStateCreateFlags local_60;
  VkBool32 local_5c;
  VkPipelineDepthStencilStateCreateInfo *local_58;
  uint local_50 [8];
  
  local_2d0._24_4_ = 0x13;
  pVVar4 = (VkVertexInputAttributeDescription *)0x0;
  local_2b0._0_4_ = 0;
  local_2b0._4_4_ = 0;
  local_2a8 = VK_STENCIL_OP_KEEP;
  local_2a0 = (VkVertexInputAttributeDescription *)
              (this->m_vertexInputBindings).
              super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
              ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(this->m_vertexInputBindings).
                super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)local_2a0;
  if (uVar7 == 0) {
    local_2a0 = pVVar4;
  }
  local_2a4 = (int)(uVar7 >> 2) * -0x55555555;
  local_290 = (this->m_vertexInputAttributes).
              super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
              ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(this->m_vertexInputAttributes).
                super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)local_290;
  if (uVar7 == 0) {
    local_290 = pVVar4;
  }
  local_298 = (deUint32)(uVar7 >> 4);
  VVar6 = VK_PRIMITIVE_TOPOLOGY_PATCH_LIST;
  if ((this->m_shaderStageFlags & 2) == 0) {
    VVar6 = this->m_primitiveTopology;
  }
  local_288.pNext = (void *)0x0;
  local_288.primitiveRestartEnable = 0;
  local_288._28_4_ = 0;
  local_288.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_288._4_4_ = 0;
  local_288._16_8_ = (ulong)VVar6 << 0x20;
  local_2d0._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_2d0._8_8_ = (void *)0x0;
  local_2d0._16_4_ = 0;
  local_2d0._20_4_ = this->m_patchControlPoints;
  iVar1 = (this->m_renderSize).m_data[0];
  local_118.format = (VkFormat)(float)iVar1;
  iVar2 = (this->m_renderSize).m_data[1];
  local_128._8_8_ = *(undefined8 *)(this->m_renderSize).m_data;
  local_118.offset = (deUint32)(float)iVar2;
  local_118.location = 0;
  local_118.binding = 0;
  local_108 = 0x3f80000000000000;
  local_128.location = 0;
  local_128.binding = 0;
  bVar9 = iVar1 < 1;
  bVar3 = iVar2 < 1;
  local_268._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_268._8_8_ = (void *)0x0;
  uVar8 = this->m_shaderStageFlags & 0x10;
  local_238.rasterizerDiscardEnable = uVar8 >> 4 ^ VK_STENCIL_OP_ZERO;
  local_268._24_8_ = &local_118;
  if (bVar9 || bVar3) {
    local_268._24_8_ = pVVar4;
  }
  local_268._16_4_ = 0;
  local_268._20_4_ = 1;
  local_240 = &local_128;
  if (bVar9 || bVar3) {
    local_240 = pVVar4;
  }
  local_248 = 1;
  local_238.sType = 0x17;
  local_238.pNext = (void *)0x0;
  local_238.flags = 0;
  local_238.depthClampEnable = 0;
  local_238.polygonMode = VK_POLYGON_MODE_FILL;
  local_238.cullMode = this->m_cullModeFlags;
  local_238.frontFace = this->m_frontFace;
  local_238.depthBiasEnable = 0;
  local_238.depthBiasConstantFactor = 0.0;
  local_238.depthBiasClamp = 0.0;
  local_238.depthBiasSlopeFactor = 0.0;
  local_238.lineWidth = 1.0;
  local_1f8._8_8_ = (void *)0x0;
  local_1f8._24_4_ = 0;
  local_1f8._28_4_ = VK_COMPARE_OP_NEVER;
  local_1f8._32_4_ = 0;
  local_1f8._36_4_ = 0;
  local_1f8._40_4_ = VK_STENCIL_OP_KEEP;
  local_1f8._44_4_ = VK_STENCIL_OP_KEEP;
  local_1f8._0_8_ = 0x18;
  local_1f8._16_4_ = 0;
  local_1f8._20_4_ = 1;
  local_190.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_190.pNext = (void *)0x0;
  local_190.flags = 0;
  local_190.depthTestEnable = 0;
  local_190.depthWriteEnable = 0;
  local_190.depthCompareOp = VK_COMPARE_OP_LESS;
  local_190.depthBoundsTestEnable = 0;
  local_190.stencilTestEnable = 0;
  local_190.front.failOp = VK_STENCIL_OP_KEEP;
  local_190.front.passOp = VK_STENCIL_OP_KEEP;
  local_190.front.depthFailOp = VK_STENCIL_OP_KEEP;
  local_190.front.compareOp = VK_COMPARE_OP_NEVER;
  local_190.front.compareMask = 0;
  local_190.front.writeMask = 0;
  local_190.front.reference = 0;
  local_190.back.failOp = VK_STENCIL_OP_KEEP;
  local_190.back.passOp = VK_STENCIL_OP_KEEP;
  local_190.back.depthFailOp = VK_STENCIL_OP_KEEP;
  local_190.back.compareOp = VK_COMPARE_OP_NEVER;
  local_190.back.compareMask = 0;
  local_190.back.writeMask = 0;
  local_190.back.reference = 0;
  local_190.minDepthBounds = 0.0;
  local_190.maxDepthBounds = 1.0;
  local_1a8 = local_50;
  local_50[0] = (uint)this->m_blendEnable;
  local_50[1] = 6;
  local_50[2] = VK_STENCIL_OP_ZERO;
  local_50[3] = VK_STENCIL_OP_KEEP;
  local_50[4] = VK_STENCIL_OP_INCREMENT_AND_WRAP;
  local_50[5] = VK_COMPARE_OP_LESS;
  local_50[6] = 0;
  local_50[7] = 0xf;
  local_1f8._48_4_ = 0x1a;
  local_1c0._0_4_ = 0;
  local_1c0._4_4_ = 0;
  uStack_1b8._0_4_ = 0;
  uStack_1b8._4_4_ = VK_STENCIL_OP_KEEP;
  local_1b0._0_4_ = VK_STENCIL_OP_INCREMENT_AND_CLAMP;
  local_1b0._4_4_ = VK_STENCIL_OP_ZERO;
  local_1a0._0_4_ = 0;
  local_1a0._4_4_ = 0;
  uStack_198._0_4_ = 0.0;
  uStack_198._4_4_ = 0.0;
  local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (VkDynamicState *)0x0;
  local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_finish = (VkDynamicState *)0x0;
  local_2d8 = device;
  if (bVar9 || bVar3) {
    local_100.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::
    _M_realloc_insert<vk::VkDynamicState>(&local_2f8,(iterator)0x0,&local_100.sType);
    local_100.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    if (local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::
      _M_realloc_insert<vk::VkDynamicState>
                (&local_2f8,
                 (iterator)
                 local_2f8.
                 super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl
                 .super__Vector_impl_data._M_finish,&local_100.sType);
    }
    else {
      *local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl
       .super__Vector_impl_data._M_finish = VK_DYNAMIC_STATE_SCISSOR;
      local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  local_70 = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  pVVar5 = (VkPipelineDepthStencilStateCreateInfo *)0x0;
  local_68 = (void *)0x0;
  local_60 = 0;
  local_100.pDynamicState = (VkPipelineDynamicStateCreateInfo *)&local_70;
  local_58 = (VkPipelineDepthStencilStateCreateInfo *)
             local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((long)local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
            _M_impl.super__Vector_impl_data._M_start == 0) {
    local_100.pDynamicState = (VkPipelineDynamicStateCreateInfo *)pVVar5;
    local_58 = pVVar5;
  }
  local_5c = (VkBool32)
             ((ulong)((long)local_2f8.
                            super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_2f8.
                           super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2);
  local_100.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_100.pNext = (void *)0x0;
  local_100.flags = 0;
  local_100.pStages =
       (this->m_shaderStages).
       super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_100.stageCount =
       (int)((ulong)((long)(this->m_shaderStages).
                           super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)local_100.pStages) >>
            4) * -0x55555555;
  local_100.pVertexInputState = (VkPipelineVertexInputStateCreateInfo *)(local_2d0 + 0x18);
  local_100.pInputAssemblyState = &local_288;
  local_100.pTessellationState = (VkPipelineTessellationStateCreateInfo *)local_2d0;
  if ((this->m_shaderStageFlags & 2) == 0) {
    local_100.pTessellationState = (VkPipelineTessellationStateCreateInfo *)pVVar5;
  }
  bVar9 = uVar8 == 0;
  local_100.pViewportState = (VkPipelineViewportStateCreateInfo *)local_268;
  if (bVar9) {
    local_100.pViewportState = (VkPipelineViewportStateCreateInfo *)pVVar5;
  }
  local_100.pRasterizationState = &local_238;
  local_100.pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)local_1f8;
  if (bVar9) {
    local_100.pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)pVVar5;
  }
  local_100.pDepthStencilState = &local_190;
  if (bVar9) {
    local_100.pDepthStencilState = pVVar5;
  }
  local_100.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)(local_1f8 + 0x30);
  if (bVar9) {
    local_100.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)pVVar5;
  }
  local_100.subpass = 0;
  local_100.basePipelineHandle.m_internal = 0;
  local_100.basePipelineIndex = 0;
  local_100.layout.m_internal = pipelineLayout.m_internal;
  local_100.renderPass.m_internal = renderPass.m_internal;
  ::vk::createGraphicsPipeline
            (__return_storage_ptr__,vk,local_2d8,(VkPipelineCache)0x0,&local_100,
             (VkAllocationCallbacks *)0x0);
  if ((VkPipelineDepthStencilStateCreateInfo *)
      local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
      super__Vector_impl_data._M_start != (VkPipelineDepthStencilStateCreateInfo *)0x0) {
    operator_delete(local_2f8.
                    super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f8.
                          super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.
                          super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipeline> GraphicsPipelineBuilder::build (const DeviceInterface&	vk,
												 const VkDevice			device,
												 const VkPipelineLayout	pipelineLayout,
												 const VkRenderPass		renderPass)
{
	const VkPipelineVertexInputStateCreateInfo vertexInputStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineVertexInputStateCreateFlags)0,						// VkPipelineVertexInputStateCreateFlags       flags;
		static_cast<deUint32>(m_vertexInputBindings.size()),			// uint32_t                                    vertexBindingDescriptionCount;
		dataPointer(m_vertexInputBindings),								// const VkVertexInputBindingDescription*      pVertexBindingDescriptions;
		static_cast<deUint32>(m_vertexInputAttributes.size()),			// uint32_t                                    vertexAttributeDescriptionCount;
		dataPointer(m_vertexInputAttributes),							// const VkVertexInputAttributeDescription*    pVertexAttributeDescriptions;
	};

	const VkPrimitiveTopology topology = (m_shaderStageFlags & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) ? VK_PRIMITIVE_TOPOLOGY_PATCH_LIST
																										 : m_primitiveTopology;
	const VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineInputAssemblyStateCreateFlags)0,						// VkPipelineInputAssemblyStateCreateFlags     flags;
		topology,														// VkPrimitiveTopology                         topology;
		VK_FALSE,														// VkBool32                                    primitiveRestartEnable;
	};

	const VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO,		// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineTessellationStateCreateFlags)0,						// VkPipelineTessellationStateCreateFlags      flags;
		m_patchControlPoints,											// uint32_t                                    patchControlPoints;
	};

	const VkViewport viewport = makeViewport(
		0.0f, 0.0f,
		static_cast<float>(m_renderSize.x()), static_cast<float>(m_renderSize.y()),
		0.0f, 1.0f);

	const VkRect2D scissor = {
		makeOffset2D(0, 0),
		makeExtent2D(m_renderSize.x(), m_renderSize.y()),
	};

	const bool haveRenderSize = m_renderSize.x() > 0 && m_renderSize.y() > 0;

	const VkPipelineViewportStateCreateInfo pipelineViewportStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,	// VkStructureType                             sType;
		DE_NULL,												// const void*                                 pNext;
		(VkPipelineViewportStateCreateFlags)0,					// VkPipelineViewportStateCreateFlags          flags;
		1u,														// uint32_t                                    viewportCount;
		haveRenderSize ? &viewport : DE_NULL,					// const VkViewport*                           pViewports;
		1u,														// uint32_t                                    scissorCount;
		haveRenderSize ? &scissor : DE_NULL,					// const VkRect2D*                             pScissors;
	};

	const bool isRasterizationDisabled = ((m_shaderStageFlags & VK_SHADER_STAGE_FRAGMENT_BIT) == 0);
	const VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,		// VkStructureType                          sType;
		DE_NULL,														// const void*                              pNext;
		(VkPipelineRasterizationStateCreateFlags)0,						// VkPipelineRasterizationStateCreateFlags  flags;
		VK_FALSE,														// VkBool32                                 depthClampEnable;
		isRasterizationDisabled,										// VkBool32                                 rasterizerDiscardEnable;
		VK_POLYGON_MODE_FILL,											// VkPolygonMode							polygonMode;
		m_cullModeFlags,												// VkCullModeFlags							cullMode;
		m_frontFace,													// VkFrontFace								frontFace;
		VK_FALSE,														// VkBool32									depthBiasEnable;
		0.0f,															// float									depthBiasConstantFactor;
		0.0f,															// float									depthBiasClamp;
		0.0f,															// float									depthBiasSlopeFactor;
		1.0f,															// float									lineWidth;
	};

	const VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineMultisampleStateCreateFlags)0,					// VkPipelineMultisampleStateCreateFlags	flags;
		VK_SAMPLE_COUNT_1_BIT,										// VkSampleCountFlagBits					rasterizationSamples;
		VK_FALSE,													// VkBool32									sampleShadingEnable;
		0.0f,														// float									minSampleShading;
		DE_NULL,													// const VkSampleMask*						pSampleMask;
		VK_FALSE,													// VkBool32									alphaToCoverageEnable;
		VK_FALSE													// VkBool32									alphaToOneEnable;
	};

	const VkStencilOpState stencilOpState = makeStencilOpState(
		VK_STENCIL_OP_KEEP,		// stencil fail
		VK_STENCIL_OP_KEEP,		// depth & stencil pass
		VK_STENCIL_OP_KEEP,		// depth only fail
		VK_COMPARE_OP_NEVER,	// compare op
		0u,						// compare mask
		0u,						// write mask
		0u);					// reference

	const VkPipelineDepthStencilStateCreateInfo pipelineDepthStencilStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineDepthStencilStateCreateFlags)0,					// VkPipelineDepthStencilStateCreateFlags	flags;
		VK_FALSE,													// VkBool32									depthTestEnable;
		VK_FALSE,													// VkBool32									depthWriteEnable;
		VK_COMPARE_OP_LESS,											// VkCompareOp								depthCompareOp;
		VK_FALSE,													// VkBool32									depthBoundsTestEnable;
		VK_FALSE,													// VkBool32									stencilTestEnable;
		stencilOpState,												// VkStencilOpState							front;
		stencilOpState,												// VkStencilOpState							back;
		0.0f,														// float									minDepthBounds;
		1.0f,														// float									maxDepthBounds;
	};

	const VkColorComponentFlags colorComponentsAll = VK_COLOR_COMPONENT_R_BIT | VK_COLOR_COMPONENT_G_BIT | VK_COLOR_COMPONENT_B_BIT | VK_COLOR_COMPONENT_A_BIT;
	const VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState =
	{
		m_blendEnable,						// VkBool32					blendEnable;
		VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcColorBlendFactor;
		VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstColorBlendFactor;
		VK_BLEND_OP_ADD,					// VkBlendOp				colorBlendOp;
		VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcAlphaBlendFactor;
		VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstAlphaBlendFactor;
		VK_BLEND_OP_ADD,					// VkBlendOp				alphaBlendOp;
		colorComponentsAll,					// VkColorComponentFlags	colorWriteMask;
	};

	const VkPipelineColorBlendStateCreateInfo pipelineColorBlendStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,	// VkStructureType								sType;
		DE_NULL,													// const void*									pNext;
		(VkPipelineColorBlendStateCreateFlags)0,					// VkPipelineColorBlendStateCreateFlags			flags;
		VK_FALSE,													// VkBool32										logicOpEnable;
		VK_LOGIC_OP_COPY,											// VkLogicOp									logicOp;
		1u,															// deUint32										attachmentCount;
		&pipelineColorBlendAttachmentState,							// const VkPipelineColorBlendAttachmentState*	pAttachments;
		{ 0.0f, 0.0f, 0.0f, 0.0f },									// float										blendConstants[4];
	};

	std::vector<VkDynamicState> dynamicStates;
	if (!haveRenderSize)
	{
		dynamicStates.push_back(VK_DYNAMIC_STATE_VIEWPORT);
		dynamicStates.push_back(VK_DYNAMIC_STATE_SCISSOR);
	}

	const VkPipelineDynamicStateCreateInfo pipelineDynamicStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO,	// VkStructureType						sType;
		DE_NULL,												// const void*							pNext;
		0,														// VkPipelineDynamicStateCreateFlags	flags;
		static_cast<deUint32>(dynamicStates.size()),			// uint32_t								dynamicStateCount;
		(dynamicStates.empty() ? DE_NULL : &dynamicStates[0]),	// const VkDynamicState*				pDynamicStates;
	};

	const VkGraphicsPipelineCreateInfo graphicsPipelineInfo =
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,						// VkStructureType									sType;
		DE_NULL,																// const void*										pNext;
		(VkPipelineCreateFlags)0,												// VkPipelineCreateFlags							flags;
		static_cast<deUint32>(m_shaderStages.size()),							// deUint32											stageCount;
		&m_shaderStages[0],														// const VkPipelineShaderStageCreateInfo*			pStages;
		&vertexInputStateInfo,													// const VkPipelineVertexInputStateCreateInfo*		pVertexInputState;
		&pipelineInputAssemblyStateInfo,										// const VkPipelineInputAssemblyStateCreateInfo*	pInputAssemblyState;
		(m_shaderStageFlags & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT ? &pipelineTessellationStateInfo : DE_NULL), // const VkPipelineTessellationStateCreateInfo*		pTessellationState;
		(isRasterizationDisabled ? DE_NULL : &pipelineViewportStateInfo),		// const VkPipelineViewportStateCreateInfo*			pViewportState;
		&pipelineRasterizationStateInfo,										// const VkPipelineRasterizationStateCreateInfo*	pRasterizationState;
		(isRasterizationDisabled ? DE_NULL : &pipelineMultisampleStateInfo),	// const VkPipelineMultisampleStateCreateInfo*		pMultisampleState;
		(isRasterizationDisabled ? DE_NULL : &pipelineDepthStencilStateInfo),	// const VkPipelineDepthStencilStateCreateInfo*		pDepthStencilState;
		(isRasterizationDisabled ? DE_NULL : &pipelineColorBlendStateInfo),		// const VkPipelineColorBlendStateCreateInfo*		pColorBlendState;
		(dynamicStates.empty() ? DE_NULL : &pipelineDynamicStateInfo),			// const VkPipelineDynamicStateCreateInfo*			pDynamicState;
		pipelineLayout,															// VkPipelineLayout									layout;
		renderPass,																// VkRenderPass										renderPass;
		0u,																		// deUint32											subpass;
		DE_NULL,																// VkPipeline										basePipelineHandle;
		0,																		// deInt32											basePipelineIndex;
	};

	return createGraphicsPipeline(vk, device, DE_NULL, &graphicsPipelineInfo);
}